

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

void * mraa_gpio_interrupt_handler(void *arg)

{
  uint uVar1;
  int iVar2;
  mraa_boolean_t mVar3;
  mraa_result_t mVar4;
  int *fds;
  int *piVar5;
  char *pcVar6;
  bool bVar7;
  char local_98 [8];
  char bu [64];
  uint *local_50;
  mraa_gpio_context it;
  int i;
  int k;
  mraa_gpiod_group_t gpio_group;
  int *fps;
  int idx;
  mraa_gpio_context dev;
  mraa_result_t ret;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    syslog(3,"gpio: interrupt_handler: context is invalid");
  }
  else {
    fps._4_4_ = 0;
    if ((((arg == (void *)0x0) || (*(long *)((long)arg + 0x48) == 0)) ||
        (*(long *)(*(long *)((long)arg + 0x48) + 0x90) == 0)) ||
       (iVar2 = (**(code **)(*(long *)((long)arg + 0x48) + 0x90))(arg), iVar2 == 0)) {
      fds = (int *)calloc((ulong)*(uint *)((long)arg + 0x68),4);
      if (fds == (int *)0x0) {
        syslog(3,"mraa_gpio_interrupt_handler_multiple() malloc error");
      }
      else {
        mVar3 = mraa_is_sub_platform_id(*arg);
        if (mVar3 == 0) {
          local_50 = (uint *)arg;
          if (plat->chardev_capable == 0) {
            for (; local_50 != (uint *)0x0; local_50 = *(uint **)(local_50 + 0x20)) {
              snprintf(local_98,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*local_50);
              iVar2 = open(local_98,0);
              fds[fps._4_4_] = iVar2;
              if (fds[fps._4_4_] < 0) {
                uVar1 = *local_50;
                piVar5 = __errno_location();
                pcVar6 = strerror(*piVar5);
                syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,
                       pcVar6);
                mraa_gpio_close_event_handles_sysfs(fds,fps._4_4_);
                return (void *)0x0;
              }
              fps._4_4_ = fps._4_4_ + 1;
            }
          }
          else {
            it._4_4_ = 0;
            while( true ) {
              bVar7 = false;
              if (it._4_4_ < *(uint *)((long)arg + 0x58)) {
                _i = *(long *)((long)arg + 0x50) + (long)(int)it._4_4_ * 0x40;
                bVar7 = _i != 0;
              }
              if (!bVar7) break;
              if (*(int *)(*(long *)((long)arg + 0x50) + (long)(int)it._4_4_ * 0x40) != 0) {
                for (it._0_4_ = 0; (uint)it < *(uint *)(_i + 0x10); it._0_4_ = (uint)it + 1) {
                  fds[fps._4_4_] = *(int *)(*(long *)(_i + 0x38) + (long)(int)(uint)it * 4);
                  fps._4_4_ = fps._4_4_ + 1;
                }
              }
              it._4_4_ = it._4_4_ + 1;
            }
          }
        }
        if (((lang_func->java_attach_thread == (_func_mraa_result_t_varargs *)0x0) ||
            (*(_func_void_void_ptr **)((long)arg + 0x10) != lang_func->java_isr_callback)) ||
           (mVar4 = (*lang_func->java_attach_thread)(), mVar4 == MRAA_SUCCESS)) {
          while( true ) {
            if (((arg == (void *)0x0) || (*(long *)((long)arg + 0x48) == 0)) ||
               (*(long *)(*(long *)((long)arg + 0x48) + 0x98) == 0)) {
              if (plat->chardev_capable == 0) {
                dev._4_4_ = mraa_gpio_wait_interrupt
                                      (fds,fps._4_4_,*(mraa_gpio_events_t *)((long)arg + 0x70));
              }
              else {
                dev._4_4_ = mraa_gpio_chardev_wait_interrupt
                                      (fds,fps._4_4_,*(mraa_gpio_events_t *)((long)arg + 0x70));
              }
            }
            else {
              dev._4_4_ = (**(code **)(*(long *)((long)arg + 0x48) + 0x98))(arg);
            }
            if ((dev._4_4_ != MRAA_SUCCESS) || (*(int *)((long)arg + 0x2c) != 0)) break;
            pthread_setcancelstate(1,(int *)0x0);
            if (lang_func->python_isr == (_func_void__func_void_void_ptr_ptr_void_ptr *)0x0) {
              (**(code **)((long)arg + 0x10))();
            }
            else {
              (*lang_func->python_isr)
                        (*(_func_void_void_ptr **)((long)arg + 0x10),*(void **)((long)arg + 0x18));
            }
            pthread_setcancelstate(0,(int *)0x0);
          }
          pthread_setcancelstate(1,(int *)0x0);
          mraa_gpio_close_event_handles_sysfs(fds,*(int *)((long)arg + 0x68));
          if ((lang_func->java_detach_thread != (_func_void_varargs *)0x0) &&
             ((lang_func->java_delete_global_ref != (_func_void_void_ptr *)0x0 &&
              (*(_func_void_void_ptr **)((long)arg + 0x10) == lang_func->java_isr_callback)))) {
            (*lang_func->java_delete_global_ref)(*(void **)((long)arg + 0x18));
            (*lang_func->java_detach_thread)();
          }
        }
        else {
          mraa_gpio_close_event_handles_sysfs(fds,*(int *)((long)arg + 0x68));
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static void*
mraa_gpio_interrupt_handler(void* arg)
{
    if (arg == NULL) {
        syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
        return NULL;
    }

    mraa_result_t ret;
    mraa_gpio_context dev = (mraa_gpio_context) arg;
    int idx = 0;

    if (IS_FUNC_DEFINED(dev, gpio_interrupt_handler_init_replace)) {
        if (dev->advance_func->gpio_interrupt_handler_init_replace(dev) != MRAA_SUCCESS)
            return NULL;
    }

    int* fps = calloc(dev->num_pins, sizeof(int));
    if (!fps) {
        syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
        return NULL;
    }

    /* Is this pin on a subplatform? Do nothing... */
    if (mraa_is_sub_platform_id(dev->pin)) {
    }
    /* Is the platform chardev_capable? */
    else if (plat->chardev_capable) {
        mraa_gpiod_group_t gpio_group;

        for_each_gpio_group(gpio_group, dev)
        {
            for (int i = 0; i < gpio_group->num_gpio_lines; ++i) {
                fps[idx++] = gpio_group->event_handles[i];
            }
        }
    }
    /* Else, attempt fs access */
    else {
        mraa_gpio_context it = dev;

        while (it) {
            // open gpio value with open(3)
            char bu[MAX_SIZE];
            snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
            fps[idx] = open(bu, O_RDONLY);
            if (fps[idx] < 0) {
                syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
                       strerror(errno));
                mraa_gpio_close_event_handles_sysfs(fps, idx);
                return NULL;
            }

            idx++;
            it = it->next;
        }
    }

#ifndef HAVE_PTHREAD_CANCEL
    if (pipe(dev->isr_control_pipe)) {
        syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to create isr control pipe: %s",
               dev->pin, strerror(errno));
        mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
        return NULL;
    }
#endif

    if (lang_func->java_attach_thread != NULL) {
        if (dev->isr == lang_func->java_isr_callback) {
            if (lang_func->java_attach_thread() != MRAA_SUCCESS) {
                mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);
                return NULL;
            }
        }
    }

    for (;;) {
        if (IS_FUNC_DEFINED(dev, gpio_wait_interrupt_replace)) {
            ret = dev->advance_func->gpio_wait_interrupt_replace(dev);
        } else {
            if (plat->chardev_capable) {
                ret = mraa_gpio_chardev_wait_interrupt(fps, idx, dev->events);
            } else {
                ret = mraa_gpio_wait_interrupt(fps, idx
#ifndef HAVE_PTHREAD_CANCEL
                                               ,
                                               dev->isr_control_pipe[0]
#endif
                                               ,
                                               dev->events);
            }
        }

        if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            if (lang_func->python_isr != NULL) {
                lang_func->python_isr(dev->isr, dev->isr_args);
            } else {
                dev->isr(dev->isr_args);
            }
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code or exit request so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            mraa_gpio_close_event_handles_sysfs(fps, dev->num_pins);

            if (lang_func->java_detach_thread != NULL && lang_func->java_delete_global_ref != NULL) {
                if (dev->isr == lang_func->java_isr_callback) {
                    lang_func->java_delete_global_ref(dev->isr_args);
                    lang_func->java_detach_thread();
                }
            }

            return NULL;
        }
    }
}